

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
Plan::DyndepsLoaded(Plan *this,DependencyScan *scan,Node *node,DyndepFile *ddf,string *err)

{
  Node *node_00;
  bool bVar1;
  reference p_Var2;
  pointer ppVar3;
  reference ppNVar4;
  reference ppNVar5;
  ulong uVar6;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar7;
  reference __x;
  pointer __x_00;
  reference __x_01;
  pair<std::_Rb_tree_const_iterator<Edge_*>,_bool> pVar8;
  _Self local_138;
  _Self local_130;
  iterator want_e_2;
  _Self local_120;
  iterator wi;
  _Self local_108;
  _Self local_100;
  iterator want_e_1;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_f0;
  const_iterator oe_2;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_e0;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_d8;
  const_iterator i;
  const_iterator oe_1;
  __normal_iterator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>_>
  local_c0;
  iterator oei;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> dyndep_walk;
  _Self local_80;
  iterator want_e;
  Edge *local_68;
  Edge *edge;
  _Self local_58;
  const_iterator oe;
  vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
  dyndep_roots;
  string *err_local;
  DyndepFile *ddf_local;
  Node *node_local;
  DependencyScan *scan_local;
  Plan *this_local;
  
  bVar1 = RefreshDyndepDependents(this,scan,node,err);
  if (bVar1) {
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
    ::vector((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
              *)&oe);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         ::begin(&ddf->
                  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                );
    while( true ) {
      edge = (Edge *)std::
                     map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                     ::end(&ddf->
                            super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                          );
      bVar1 = std::operator!=(&local_58,(_Self *)&edge);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_58)
      ;
      local_68 = ppVar3->first;
      bVar1 = Edge::outputs_ready(local_68);
      if (!bVar1) {
        local_80._M_node =
             (_Base_ptr)
             std::
             map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
             ::find(&this->want_,&local_68);
        dyndep_walk._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                     ::end(&this->want_);
        bVar1 = std::operator==(&local_80,
                                (_Self *)&dyndep_walk._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
        if (!bVar1) {
          std::
          vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
          ::push_back((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
                       *)&oe,&local_58);
        }
      }
      std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator++(&local_58);
    }
    std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::set
              ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei);
    local_c0._M_current =
         (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)
         std::
         vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
         ::begin((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
                  *)&oe);
    while( true ) {
      oe_1._M_node = (_Base_ptr)
                     std::
                     vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
                     ::end((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
                            *)&oe);
      bVar1 = __gnu_cxx::operator!=
                        (&local_c0,
                         (__normal_iterator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>_>
                          *)&oe_1);
      if (!bVar1) break;
      p_Var2 = __gnu_cxx::
               __normal_iterator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>_>
               ::operator*(&local_c0);
      i._M_current = (Node **)p_Var2->_M_node;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)&i);
      local_d8._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              (&(ppVar3->second).implicit_inputs_);
      while( true ) {
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)&i);
        local_e0._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                (&(ppVar3->second).implicit_inputs_);
        bVar1 = __gnu_cxx::operator!=(&local_d8,&local_e0);
        if (!bVar1) break;
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_d8);
        node_00 = *ppNVar4;
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)&i);
        ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            (&ppVar3->first->outputs_,0);
        bVar1 = AddSubTarget(this,node_00,*ppNVar5,err,
                             (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei);
        if ((!bVar1) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          this_local._7_1_ = false;
          goto LAB_0010fe0a;
        }
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_d8);
      }
      __gnu_cxx::
      __normal_iterator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_*,_std::vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>_>
      ::operator++(&local_c0);
    }
    pvVar7 = Node::out_edges(node);
    local_f0._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar7);
    while( true ) {
      pvVar7 = Node::out_edges(node);
      want_e_1._M_node = (_Base_ptr)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar7);
      bVar1 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)&want_e_1);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
            operator*(&local_f0);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::find(&this->want_,__x);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::end(&this->want_);
      bVar1 = std::operator==(&local_100,&local_108);
      if (!bVar1) {
        __x_00 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_100)
        ;
        pVar8 = std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::insert
                          ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei,
                           &__x_00->first);
        wi._M_node = (_Base_ptr)pVar8.first._M_node;
      }
      __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_f0);
    }
    local_120._M_node =
         (_Base_ptr)
         std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::begin
                   ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei);
    while( true ) {
      want_e_2._M_node =
           (_Base_ptr)
           std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::end
                     ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei);
      bVar1 = std::operator!=(&local_120,(_Self *)&want_e_2);
      if (!bVar1) break;
      __x_01 = std::_Rb_tree_const_iterator<Edge_*>::operator*(&local_120);
      local_130._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::find(&this->want_,__x_01);
      local_138._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::end(&this->want_);
      bVar1 = std::operator==(&local_130,&local_138);
      if ((!bVar1) && (bVar1 = EdgeMaybeReady(this,(iterator)local_130._M_node,err), !bVar1)) {
        this_local._7_1_ = false;
        goto LAB_0010fe0a;
      }
      std::_Rb_tree_const_iterator<Edge_*>::operator++(&local_120);
    }
    this_local._7_1_ = true;
LAB_0010fe0a:
    oe_2._M_current._4_4_ = 1;
    std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::~set
              ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&oei);
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
    ::~vector((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
               *)&oe);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Plan::DyndepsLoaded(DependencyScan* scan, const Node* node,
                         const DyndepFile& ddf, string* err) {
  // Recompute the dirty state of all our direct and indirect dependents now
  // that our dyndep information has been loaded.
  if (!RefreshDyndepDependents(scan, node, err))
    return false;

  // We loaded dyndep information for those out_edges of the dyndep node that
  // specify the node in a dyndep binding, but they may not be in the plan.
  // Starting with those already in the plan, walk newly-reachable portion
  // of the graph through the dyndep-discovered dependencies.

  // Find edges in the the build plan for which we have new dyndep info.
  std::vector<DyndepFile::const_iterator> dyndep_roots;
  for (DyndepFile::const_iterator oe = ddf.begin(); oe != ddf.end(); ++oe) {
    Edge* edge = oe->first;

    // If the edge outputs are ready we do not need to consider it here.
    if (edge->outputs_ready())
      continue;

    map<Edge*, Want>::iterator want_e = want_.find(edge);

    // If the edge has not been encountered before then nothing already in the
    // plan depends on it so we do not need to consider the edge yet either.
    if (want_e == want_.end())
      continue;

    // This edge is already in the plan so queue it for the walk.
    dyndep_roots.push_back(oe);
  }

  // Walk dyndep-discovered portion of the graph to add it to the build plan.
  std::set<Edge*> dyndep_walk;
  for (std::vector<DyndepFile::const_iterator>::iterator
       oei = dyndep_roots.begin(); oei != dyndep_roots.end(); ++oei) {
    DyndepFile::const_iterator oe = *oei;
    for (vector<Node*>::const_iterator i = oe->second.implicit_inputs_.begin();
         i != oe->second.implicit_inputs_.end(); ++i) {
      if (!AddSubTarget(*i, oe->first->outputs_[0], err, &dyndep_walk) &&
          !err->empty())
        return false;
    }
  }

  // Add out edges from this node that are in the plan (just as
  // Plan::NodeFinished would have without taking the dyndep code path).
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;
    dyndep_walk.insert(want_e->first);
  }

  // See if any encountered edges are now ready.
  for (set<Edge*>::iterator wi = dyndep_walk.begin();
       wi != dyndep_walk.end(); ++wi) {
    map<Edge*, Want>::iterator want_e = want_.find(*wi);
    if (want_e == want_.end())
      continue;
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }

  return true;
}